

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void join(level *lev,int a,int b,boolean nxcor)

{
  bool bVar1;
  uint y;
  char cVar2;
  char cVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  char cVar9;
  long lVar10;
  undefined8 uVar11;
  char cVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char cVar15;
  int x;
  mkroom *pmVar16;
  ulong uVar17;
  char cVar18;
  int y_00;
  mkroom *croom;
  char cVar19;
  coord tt;
  coord cc;
  coord dest;
  coord org;
  coord local_90;
  coord local_8e;
  undefined4 local_8c;
  int local_88;
  uint local_84;
  undefined8 local_80;
  undefined8 local_78;
  mkroom *local_70;
  undefined8 local_68;
  undefined8 local_60;
  coord local_54;
  coord local_52;
  mkroom *local_50;
  long local_48;
  long local_40;
  mkroom *local_38;
  
  uVar17 = (ulong)(uint)a;
  uVar8 = CONCAT71(in_register_00000009,nxcor);
  do {
    local_84 = (uint)uVar17;
    if (local_84 == b) {
      return;
    }
    lVar10 = (long)b;
    cVar3 = lev->rooms[lVar10].hx;
    if (cVar3 < '\0') {
      return;
    }
    local_48 = (long)(int)local_84;
    local_38 = lev->rooms + local_48;
    cVar2 = lev->rooms[local_48].hx;
    if (cVar2 < '\0') {
      return;
    }
    if (0x77 < lev->doorindex) {
      return;
    }
    pmVar16 = lev->rooms + lVar10;
    cVar18 = pmVar16->lx;
    local_8c = (undefined4)uVar8;
    local_50 = pmVar16;
    local_40 = lVar10;
    if (cVar2 < cVar18) {
      cVar2 = cVar2 + '\x01';
      cVar18 = cVar18 + -1;
      uVar11 = 0;
      cVar3 = lev->rooms[local_48].ly;
      cVar19 = false;
      if (cVar2 == cVar18) {
        if (cVar3 == lev->rooms[lVar10].ly) {
          cVar19 = lev->rooms[local_48].hy == lev->rooms[lVar10].hy;
        }
        else {
          cVar19 = false;
        }
      }
      finddpos(lev,&local_8e,cVar2,cVar3,cVar2,lev->rooms[local_48].hy);
      cVar3 = lev->rooms[lVar10].hy;
      uVar17 = (ulong)(uint)(int)cVar3;
      uVar8 = (ulong)(uint)(int)cVar18;
      finddpos(lev,&local_90,cVar18,lev->rooms[lVar10].ly,cVar18,cVar3);
      uVar7 = 1;
LAB_001d7cd0:
      cVar3 = (char)local_8c;
      iVar6 = (int)uVar11;
      iVar5 = (int)uVar7;
      uVar13 = uVar11;
      uVar14 = uVar7;
      if (cVar19 != '\0') {
        local_68 = CONCAT71((int7)(uVar17 >> 8),local_8e.x);
        local_60 = CONCAT71((int7)(uVar8 >> 8),local_8e.y);
        bVar1 = true;
        goto LAB_001d7ebe;
      }
    }
    else {
      cVar15 = lev->rooms[lVar10].hy;
      cVar12 = lev->rooms[local_48].ly;
      if (cVar15 < cVar12) {
        cVar12 = cVar12 + -1;
        cVar15 = cVar15 + '\x01';
        cVar19 = cVar3 == cVar2 && (cVar18 == local_38->lx && cVar12 == cVar15);
        finddpos(lev,&local_8e,local_38->lx,cVar12,cVar2,cVar12);
        cVar3 = lev->rooms[lVar10].hx;
        uVar8 = (ulong)(uint)(int)cVar3;
        uVar17 = (ulong)(uint)(int)cVar15;
        finddpos(lev,&local_90,pmVar16->lx,cVar15,cVar3,cVar15);
        uVar11 = 0xffffffff;
        uVar7 = 0;
        goto LAB_001d7cd0;
      }
      cVar9 = local_38->lx;
      if (cVar3 < cVar9) {
        cVar9 = cVar9 + -1;
        cVar3 = cVar3 + '\x01';
        uVar11 = 0;
        cVar19 = false;
        if (cVar9 == cVar3) {
          if (cVar12 == lev->rooms[lVar10].ly) {
            cVar19 = lev->rooms[local_48].hy == cVar15;
          }
          else {
            cVar19 = false;
          }
        }
        finddpos(lev,&local_8e,cVar9,cVar12,cVar9,lev->rooms[local_48].hy);
        cVar2 = lev->rooms[lVar10].hy;
        uVar17 = (ulong)(uint)(int)cVar2;
        uVar8 = (ulong)(uint)(int)cVar3;
        finddpos(lev,&local_90,cVar3,lev->rooms[lVar10].ly,cVar3,cVar2);
        uVar7 = 0xffffffff;
        goto LAB_001d7cd0;
      }
      cVar12 = lev->rooms[local_48].hy + '\x01';
      cVar15 = lev->rooms[lVar10].ly + -1;
      local_88 = (int)CONCAT71((int7)(uVar17 >> 8),cVar2 == cVar3);
      finddpos(lev,&local_8e,cVar9,cVar12,cVar2,cVar12);
      cVar3 = lev->rooms[lVar10].hx;
      uVar8 = (ulong)(uint)(int)cVar3;
      cVar19 = (char)local_88;
      uVar17 = (ulong)(uint)(int)cVar15;
      finddpos(lev,&local_90,pmVar16->lx,cVar15,cVar3,cVar15);
      uVar11 = 1;
      uVar7 = 0;
      uVar13 = 1;
      uVar14 = 0;
      if (cVar18 == cVar9 && cVar12 == cVar15) goto LAB_001d7cd0;
    }
    local_68 = CONCAT71((int7)(uVar17 >> 8),local_8e.x);
    local_60 = CONCAT71((int7)(uVar8 >> 8),local_8e.y);
    uVar11 = uVar13;
    uVar7 = uVar14;
    if (lev->nroom < 1) {
LAB_001d7eb9:
      cVar3 = (char)local_8c;
      bVar1 = false;
      iVar6 = (int)uVar11;
      iVar5 = (int)uVar7;
LAB_001d7ebe:
      local_88 = (int)local_90.x;
      local_84 = (uint)local_90.y;
      x = (int)(char)local_68;
      y_00 = (int)(char)local_60;
      if ((cVar3 != '\0') && ((bool)(~bVar1 & lev->locations[iVar5 + x][iVar6 + y_00].typ != '\0')))
      {
        return;
      }
      iVar5 = okdoor(lev,(char)local_68,(char)local_60);
      cVar3 = (char)local_8c;
      if ((cVar3 == '\0') || (iVar5 != 0)) {
        dodoor(lev,x,y_00,local_38);
        cVar3 = (char)local_8c;
      }
      y = local_84;
      iVar5 = local_88;
      if (bVar1) {
        add_door(lev,x,y_00,local_50);
      }
      else {
        cVar2 = (char)local_88;
        local_54.x = cVar2 - (char)uVar7;
        cVar18 = (char)local_84;
        local_54.y = cVar18 - (char)uVar11;
        local_52.x = (char)local_68 + (char)uVar7;
        local_52.y = (char)local_60 + (char)uVar11;
        bVar4 = dig_corridor(lev,&local_52,&local_54,cVar3,
                             ((*(uint *)&(lev->flags).field_0x8 >> 0x14 & 1) != 0) + '\x18','\0');
        if (bVar4 == '\0') {
          if (cVar3 != '\0') {
            return;
          }
          warning("failed to dig required corridor");
          return;
        }
        iVar6 = okdoor(lev,cVar2,cVar18);
        if ((cVar3 == '\0') || (iVar6 != 0)) {
          dodoor(lev,iVar5,y,local_50);
        }
      }
      if (smeq[local_48] < smeq[local_40]) {
        smeq[local_40] = smeq[local_48];
        return;
      }
      smeq[local_48] = smeq[local_40];
      return;
    }
    pmVar16 = lev->rooms;
    cVar3 = local_8e.x + (char)uVar14;
    cVar2 = local_8e.y + (char)uVar13;
    iVar5 = 0;
    local_80 = uVar14;
    local_78 = uVar13;
    local_70 = pmVar16;
    do {
      bVar4 = inside_room(pmVar16,cVar3,cVar2);
      if (bVar4 != '\0') {
        iVar6 = lev->nroom;
        goto LAB_001d7d6e;
      }
      pmVar16 = pmVar16 + 1;
      iVar5 = iVar5 + 1;
      iVar6 = lev->nroom;
    } while (iVar5 < iVar6);
    pmVar16 = (mkroom *)0x0;
LAB_001d7d6e:
    if (iVar6 < 1) {
      croom = (mkroom *)0x0;
    }
    else {
      cVar3 = local_90.y - (char)local_78;
      local_88 = (int)(char)(local_90.x - (char)local_80);
      iVar5 = 0;
      croom = local_70;
      do {
        bVar4 = inside_room(croom,(xchar)local_88,cVar3);
        if (bVar4 != '\0') goto LAB_001d7e5e;
        croom = croom + 1;
        iVar5 = iVar5 + 1;
      } while (iVar5 < lev->nroom);
      croom = (mkroom *)0x0;
    }
LAB_001d7e5e:
    if ((pmVar16 == (mkroom *)0x0) ||
       (uVar17 = ((long)pmVar16 - (long)local_70 >> 3) * -0x7b425ed097b425ed, uVar17 - local_40 == 0
       )) {
      uVar11 = local_78;
      uVar7 = local_80;
      if ((croom == (mkroom *)0x0) ||
         (lVar10 = ((long)croom - (long)local_70 >> 3) * -0x7b425ed097b425ed, lVar10 - local_48 == 0
         )) goto LAB_001d7eb9;
      uVar17 = (ulong)local_84;
      b = (int)lVar10;
    }
    else {
      uVar17 = uVar17 & 0xffffffff;
    }
    uVar8 = (ulong)(uint)(int)(char)local_8c;
  } while( true );
}

Assistant:

static void join(struct level *lev, int a, int b, boolean nxcor)
{
	coord cc,tt, org, dest;
	xchar tx, ty, xx, yy;
	struct mkroom *croom, *troom;
	struct mkroom *couter, *touter;
	int dx, dy;
	boolean splithalves;	/* we're joining two halves of a split room */

	if (a == b) return;

	croom = &lev->rooms[a];
	troom = &lev->rooms[b];

	/* find positions cc and tt for doors in croom and troom
	   and direction for a corridor between them */

	if (troom->hx < 0 || croom->hx < 0 || lev->doorindex >= DOORMAX) return;
	if (troom->lx > croom->hx) {
		/* t is right of c */
		dx =  1;
		dy =  0;
		xx = croom->hx+1;
		tx = troom->lx-1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else if (troom->hy < croom->ly) {
		/* t is above c */
		dx =  0;
		dy = -1;
		yy = croom->ly-1;
		ty = troom->hy+1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	} else if (troom->hx < croom->lx) {
		/* t is left of c */
		dx = -1;
		dy =  0;
		xx = croom->lx-1;
		tx = troom->hx+1;
		splithalves = xx == tx &&
			      croom->ly == troom->ly &&
			      croom->hy == troom->hy;
		finddpos(lev, &cc, xx, croom->ly, xx, croom->hy);
		finddpos(lev, &tt, tx, troom->ly, tx, troom->hy);
	} else {
		/* t should be below c */
		dx =  0;
		dy =  1;
		yy = croom->hy+1;
		ty = troom->ly-1;
		splithalves = yy == ty &&
			      croom->lx == troom->lx &&
			      croom->hx == troom->hx;
		finddpos(lev, &cc, croom->lx, yy, croom->hx, yy);
		finddpos(lev, &tt, troom->lx, ty, troom->hx, ty);
	}

	if (!splithalves) {
	    /* two halves of a split room should be connected, so if another
	       room (itself split or otherwise) tries to connect to one of the
	       halves via its unreachable middle wall, proxy the join to the
	       other half, which should be positioned better for the join */
	    couter = pos_to_room(lev, cc.x+dx, cc.y+dy);
	    touter = pos_to_room(lev, tt.x-dx, tt.y-dy);
	    if (couter && couter - lev->rooms != b) {
		    join(lev, couter - lev->rooms, b, nxcor);
		    return;
	    }
	    if (touter && touter - lev->rooms != a) {
		    join(lev, a, touter - lev->rooms, nxcor );
		    return;
	    }
	}

	xx = cc.x;
	yy = cc.y;
	tx = tt.x - dx;
	ty = tt.y - dy;
	if (nxcor && lev->locations[xx+dx][yy+dy].typ && !splithalves)
		return;
	if (okdoor(lev, xx, yy) || !nxcor)
		dodoor(lev, xx, yy, croom);

	if (splithalves) {
		/* common door already made, so just do bookkeeping */
		add_door(lev, xx, yy, troom);
	} else {
		org.x  = xx+dx;
		org.y  = yy+dy;
		dest.x = tx;
		dest.y = ty;

		if (!dig_corridor(lev, &org, &dest, nxcor,
				  lev->flags.arboreal ? ROOM : CORR, STONE)) {
			if (!nxcor)
				warning("failed to dig required corridor");
			return;
		}

		/* we succeeded in digging the corridor */
		if (okdoor(lev, tt.x, tt.y) || !nxcor)
			dodoor(lev, tt.x, tt.y, troom);
	}

	if (smeq[a] < smeq[b])
		smeq[b] = smeq[a];
	else
		smeq[a] = smeq[b];
}